

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_MemSaveCut(Lf_Mem_t *p,Lf_Cut_t *pCut,int iObj)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  void *Entry;
  uchar *pBuffer;
  ulong uVar7;
  
  if ((pCut->field_0x16 & 0x80) != 0) {
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x211,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  uVar2 = p->iCur;
  uVar6 = uVar2;
  if ((p->vPages).nSize == (int)uVar2 >> ((byte)p->LogPage & 0x1f)) {
    pVVar5 = p->vFree;
    iVar3 = pVVar5->nSize;
    if (iVar3 == 0) {
      Entry = malloc((long)p->MaskPage + 1);
    }
    else {
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      pVVar5->nSize = iVar3 - 1U;
      Entry = pVVar5->pArray[iVar3 - 1U];
    }
    Vec_PtrPush(&p->vPages,Entry);
    uVar6 = p->iCur;
  }
  uVar4 = p->MaskPage;
  if (0x37 < (int)(~uVar6 & uVar4)) {
    pBuffer = (uchar *)Vec_PtrEntry(&p->vPages,(int)uVar6 >> ((byte)p->LogPage & 0x1f));
    uVar6 = Gia_AigerWriteUnsignedBuffer(pBuffer,uVar4 & uVar2,(uint)(byte)pCut->field_0x17);
    for (uVar7 = (ulong)(byte)pCut->field_0x17; 0 < (long)uVar7; uVar7 = uVar7 - 1) {
      uVar6 = Gia_AigerWriteUnsignedBuffer
                        (pBuffer,uVar6,iObj - *(int *)(&pCut->field_0x14 + uVar7 * 4));
      iObj = *(int *)(&pCut->field_0x14 + uVar7 * 4);
    }
    uVar4 = pCut->iFunc;
    if ((int)uVar4 < 4 || 0x1ffffff < *(uint *)&pCut->field_0x14) {
      if (-1 < (int)uVar4) {
        uVar6 = Gia_AigerWriteUnsignedBuffer(pBuffer,uVar6,uVar4);
      }
      if ((int)(~uVar6 & p->MaskPage) < 0x38) {
        bVar1 = (byte)p->LogPage;
        uVar6 = (p->iCur >> (bVar1 & 0x1f)) + 1 << (bVar1 & 0x1f);
      }
      else {
        uVar6 = p->iCur & ~p->MaskPage | uVar6;
      }
      p->iCur = uVar6;
      return uVar2;
    }
    __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x21a,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  __assert_fail("p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x214,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
}

Assistant:

static inline int Lf_MemSaveCut( Lf_Mem_t * p, Lf_Cut_t * pCut, int iObj )
{
    unsigned char * pPlace;
    int i, iPlace, Prev = iObj, iCur = p->iCur;
    assert( !pCut->fMux7 );
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> p->LogPage) )
        Vec_PtrPush( &p->vPages, Vec_PtrSize(p->vFree) ? Vec_PtrPop(p->vFree) : ABC_ALLOC(char,p->MaskPage+1) );
    assert( p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2) );
    iPlace = iCur & p->MaskPage;
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, p->iCur >> p->LogPage);
    iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->nLeaves );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, Prev - pCut->pLeaves[i] ), Prev = pCut->pLeaves[i];
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( pCut->iFunc >= 0 )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->iFunc );
    if ( p->MaskPage - (iPlace & p->MaskPage) < 4 * (LF_LEAF_MAX + 2) )
        p->iCur = ((p->iCur >> p->LogPage) + 1) << p->LogPage;
    else
        p->iCur = (p->iCur & ~p->MaskPage) | iPlace;
    return iCur;
}